

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int VP8LGetHistoImageSymbols
              (int xsize,int ysize,VP8LBackwardRefs *refs,int quality,int low_effort,
              int histogram_bits,int cache_bits,VP8LHistogramSet *image_histo,
              VP8LHistogram *tmp_histo,uint16_t *histogram_symbols)

{
  HistogramPair *pHVar1;
  undefined1 auVar2 [16];
  ushort uVar3;
  ushort uVar4;
  VP8LHistogram *pVVar5;
  undefined8 *puVar6;
  void *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  bool bVar10;
  HistogramPair *pHVar11;
  VP8LHistogram *pVVar12;
  int tmp;
  int iVar13;
  anon_struct_4_2_be341b0f aVar14;
  anon_struct_4_2_be341b0f aVar15;
  VP8LHistogramSet *set;
  uint16_t *puVar16;
  void *__dest;
  byte bVar17;
  ulong uVar18;
  undefined8 uVar19;
  uint16_t uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  HistogramPair *pHVar24;
  VP8LHistogram **ppVVar25;
  long lVar26;
  uint16_t uVar27;
  double dVar28;
  short sVar29;
  short sVar30;
  uint16_t *__s;
  PixOrCopy *v;
  long lVar31;
  int iVar32;
  uint uVar33;
  VP8LHistogram **ppVVar34;
  ulong uVar35;
  undefined4 uVar36;
  float fVar37;
  anon_struct_4_2_be341b0f aVar38;
  undefined4 uVar39;
  anon_struct_4_2_be341b0f aVar40;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined4 uVar41;
  double range_1;
  undefined4 uVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double range;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  undefined1 auVar53 [16];
  int num_used;
  VP8LHistogram **local_1c0;
  int local_1b8;
  anon_struct_4_2_be341b0f local_1b4;
  void *local_1b0;
  undefined1 local_1a8 [16];
  VP8LHistogram *local_198;
  HistoQueue local_190;
  uint16_t *local_180;
  VP8LHistogramSet *local_178;
  VP8LHistogram *local_170;
  double local_168;
  undefined8 uStack_160;
  int local_150;
  int local_14c;
  undefined1 local_148 [16];
  anon_struct_4_2_be341b0f bin_info [64];
  
  local_148._8_8_ = local_148._0_8_;
  local_1b0 = (void *)CONCAT44(local_1b0._4_4_,low_effort);
  bVar17 = (byte)histogram_bits;
  if (histogram_bits == 0) {
    dVar28 = 4.94065645841247e-324;
  }
  else {
    iVar21 = 1 << (bVar17 & 0x1f);
    dVar28 = (double)(ulong)(((ysize + iVar21) - 1U >> (bVar17 & 0x1f)) *
                            ((xsize + iVar21) - 1U >> (bVar17 & 0x1f)));
  }
  iVar21 = SUB84(dVar28,0);
  local_1b8 = quality;
  set = VP8LAllocateHistogramSet(iVar21,cache_bits);
  local_148._0_8_ = 0x40;
  if ((int)local_1b0 != 0) {
    local_148._0_8_ = 4;
  }
  puVar16 = (uint16_t *)WebPSafeMalloc((ulong)(uint)(iVar21 * 2),8);
  num_used = iVar21;
  local_180 = puVar16;
  if (puVar16 == (uint16_t *)0x0 || set == (VP8LHistogramSet *)0x0) goto LAB_0013494d;
  local_170 = tmp_histo;
  local_1c0 = (VP8LHistogram **)
              CONCAT44(local_1c0._4_4_,(xsize + (1 << (bVar17 & 0x1f))) - 1U >> (bVar17 & 0x1f));
  local_1a8._0_8_ = set->histograms;
  local_168 = dVar28;
  VP8LRefsCursorInit((VP8LRefsCursor *)bin_info,refs);
  local_178 = set;
  VP8LHistogramSetClear(set);
  iVar32 = 0;
  iVar21 = 0;
  while (uVar19 = bin_info._0_8_, bin_info._0_8_ != 0) {
    VP8LHistogramAddSinglePixOrCopy
              (*(VP8LHistogram **)
                (local_1a8._0_8_ +
                (long)((iVar21 >> (bVar17 & 0x1f)) + (iVar32 >> (bVar17 & 0x1f)) * (int)local_1c0) *
                8),(PixOrCopy *)bin_info._0_8_,(_func_int_int_int *)0x0,0);
    iVar21 = iVar21 + (uint)*(ushort *)(uVar19 + 2);
    while (xsize <= iVar21) {
      iVar32 = iVar32 + 1;
      iVar21 = iVar21 - xsize;
    }
    VP8LRefsCursorNext((VP8LRefsCursor *)bin_info);
  }
  bin_info._0_8_ = (ulong)local_168 & 0xffffffff;
  local_1a8._0_8_ = local_178->histograms;
  local_198 = (VP8LHistogram *)image_histo->histograms;
  ppVVar25 = (VP8LHistogram **)0x0;
  for (lVar31 = 0; lVar31 < local_178->max_size; lVar31 = lVar31 + 1) {
    pVVar5 = *(VP8LHistogram **)(local_1a8._0_8_ + lVar31 * 8);
    UpdateHistogramCost(pVVar5);
    if ((((pVVar5->is_used_[0] == '\0') && (pVVar5->is_used_[1] == '\0')) &&
        (pVVar5->is_used_[2] == '\0')) &&
       ((pVVar5->is_used_[3] == '\0' && (pVVar5->is_used_[4] == '\0')))) {
      HistogramSetRemoveHistogram(image_histo,(int)lVar31,&num_used);
      HistogramSetRemoveHistogram(local_178,(int)lVar31,(int *)bin_info);
      uVar27 = 0xffff;
    }
    else {
      puVar6 = *(undefined8 **)(local_198->red_ + lVar31 * 2 + -2);
      iVar21 = *(int *)(puVar6 + 0x195);
      iVar13 = (4 << ((byte)iVar21 & 0x1f)) + 0x1138;
      iVar32 = (1 << ((byte)iVar21 & 0x1f)) + 0x118;
      if (iVar21 < 1) {
        iVar32 = 0x118;
      }
      pvVar7 = (void *)*puVar6;
      if (iVar21 < 1) {
        iVar13 = 0x1138;
      }
      local_1c0 = ppVVar25;
      memcpy(puVar6,pVVar5,(long)iVar13);
      *puVar6 = pvVar7;
      memcpy(pvVar7,pVVar5->literal_,(long)iVar32 << 2);
      uVar27 = (uint16_t)local_1c0;
      ppVVar25 = (VP8LHistogram **)(ulong)((int)local_1c0 + 1);
    }
    histogram_symbols[lVar31] = uVar27;
  }
  uVar35 = (ulong)(uint)num_used;
  uVar33 = local_148._0_4_;
  if (local_1b8 < 100 &&
      (num_used != uVar33 * 2 && SBORROW4(num_used,uVar33 * 2) == (int)(num_used + uVar33 * -2) < 0)
     ) {
    if (local_1b8 < 0x5a) {
      iVar21 = SUB84(local_168,0);
      local_1a8._0_8_ = *(undefined8 *)(&DAT_00141960 + (ulong)(0x100 < iVar21) * 8);
      if (0x200 < iVar21) {
        local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.5;
      }
      if (0x400 < iVar21) {
        local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.5;
      }
      if (local_1b8 < 0x33) {
        local_1a8._0_8_ = (double)local_1a8._0_8_ * 0.5;
      }
    }
    else {
      local_1a8._0_8_ = 0x3fc47ae147ae147b;
    }
    ppVVar25 = image_histo->histograms;
    uVar22 = image_histo->size;
    uVar23 = 0;
    uVar18 = 0;
    if (0 < (int)uVar22) {
      uVar18 = (ulong)uVar22;
    }
    uVar41 = 0;
    uVar42 = 0;
    uVar43 = 0;
    uVar44 = 0;
    dVar47 = 0.0;
    uVar36 = 0x2a16a1b1;
    uVar39 = 0x47d2ced3;
    dVar52 = 1e+38;
    dVar48 = 1e+38;
    for (; uVar18 != uVar23; uVar23 = uVar23 + 1) {
      pVVar5 = ppVVar25[uVar23];
      if (pVVar5 == (VP8LHistogram *)0x0) {
        auVar53._4_4_ = uVar42;
        auVar53._0_4_ = uVar41;
        auVar53._12_4_ = uVar44;
        auVar53._8_4_ = uVar43;
      }
      else {
        dVar49 = pVVar5->literal_cost_;
        dVar50 = dVar49;
        if (dVar49 <= dVar47) {
          dVar50 = dVar47;
        }
        if (dVar48 <= dVar49) {
          dVar49 = dVar48;
        }
        auVar2._0_8_ = pVVar5->red_cost_;
        auVar2._8_8_ = pVVar5->blue_cost_;
        dVar51 = (double)auVar2._0_8_;
        if (dVar52 <= (double)auVar2._0_8_) {
          dVar51 = dVar52;
        }
        auVar8._4_4_ = uVar42;
        auVar8._0_4_ = uVar41;
        auVar8._8_4_ = uVar43;
        auVar8._12_4_ = uVar44;
        auVar53 = maxpd(auVar2,auVar8);
        dVar48 = dVar49;
        dVar47 = dVar50;
        dVar52 = dVar51;
        if ((double)auVar2._8_8_ <= (double)CONCAT44(uVar39,uVar36) &&
            (double)CONCAT44(uVar39,uVar36) != (double)auVar2._8_8_) {
          uVar36 = (undefined4)auVar2._8_8_;
          uVar39 = (undefined4)((ulong)auVar2._8_8_ >> 0x20);
        }
      }
      uVar41 = auVar53._0_4_;
      uVar42 = auVar53._4_4_;
      uVar43 = auVar53._8_4_;
      uVar44 = auVar53._12_4_;
    }
    dVar50 = (double)CONCAT44(uVar42,uVar41) - dVar52;
    dVar49 = (double)CONCAT44(uVar44,uVar43) - (double)CONCAT44(uVar39,uVar36);
    for (uVar23 = 0; uVar18 != uVar23; uVar23 = uVar23 + 1) {
      pVVar5 = ppVVar25[uVar23];
      if (pVVar5 != (VP8LHistogram *)0x0) {
        uVar27 = (uint16_t)(int)(((pVVar5->literal_cost_ - dVar48) * 3.999999) / (dVar47 - dVar48));
        if (dVar47 - dVar48 <= 0.0) {
          uVar27 = 0;
        }
        if ((int)local_1b0 == 0) {
          sVar30 = (short)((int)(((pVVar5->red_cost_ - dVar52) * 3.999999) / dVar50) << 2);
          if (dVar50 <= 0.0) {
            sVar30 = 0;
          }
          sVar29 = (short)(int)(((pVVar5->blue_cost_ - (double)CONCAT44(uVar39,uVar36)) * 3.999999)
                               / dVar49);
          if (dVar49 <= 0.0) {
            sVar29 = 0;
          }
          uVar27 = uVar27 * 0x10 + sVar29 + sVar30;
        }
        local_180[uVar23] = uVar27;
      }
    }
    uVar36 = local_1a8._0_4_;
    uVar39 = local_1a8._4_4_;
    for (uVar18 = 0; uVar33 != uVar18; uVar18 = uVar18 + 1) {
      bin_info[uVar18].first = -1;
      bin_info[uVar18].num_combine_failures = 0;
    }
    for (uVar18 = 0; uVar35 != uVar18; uVar18 = uVar18 + 1) {
      puVar16[(long)dVar28 + uVar18] = (uint16_t)uVar18;
    }
    lVar31 = 0;
    __s = local_180;
    local_1c0 = ppVVar25;
    while( true ) {
      if ((int)uVar22 <= lVar31) break;
      pVVar5 = ppVVar25[lVar31];
      if (pVVar5 != (VP8LHistogram *)0x0) {
        uVar3 = __s[lVar31];
        lVar26 = (long)bin_info[uVar3].first;
        if (lVar26 == -1) {
          bin_info[uVar3].first = (int16_t)lVar31;
        }
        else if ((int)local_1b0 == 0) {
          dVar48 = (double)((ulong)pVVar5->bit_cost_ ^ (ulong)DAT_00141970) *
                   (double)CONCAT44(uVar39,uVar36);
          local_198 = ppVVar25[lVar26];
          local_190.queue = (HistogramPair *)0x0;
          local_168 = pVVar5->bit_cost_ + local_198->bit_cost_;
          local_148._8_4_ = DAT_00141970._8_4_;
          local_148._0_8_ = dVar48;
          local_148._12_4_ = DAT_00141970._12_4_;
          uStack_160 = 0;
          iVar21 = GetCombinedHistogramEntropy
                             (local_198,pVVar5,dVar48 + local_168,(double *)&local_190);
          pVVar12 = local_170;
          if (iVar21 == 0) {
            uVar36 = SUB84(local_190.queue,0);
            uVar39 = (undefined4)((ulong)local_190.queue >> 0x20);
          }
          else {
            HistogramAdd(local_198,pVVar5,local_170);
            uVar36 = SUB84(local_190.queue,0);
            uVar39 = (undefined4)((ulong)local_190.queue >> 0x20);
            pVVar12->bit_cost_ = (double)local_190.queue;
            pVVar12->palette_code_bits_ = local_198->palette_code_bits_;
          }
          if ((double)CONCAT44(uVar39,uVar36) - local_168 < (double)local_148._0_8_) {
            if (((local_170->trivial_symbol_ == 0xffffffff) &&
                ((local_1c0[lVar31]->trivial_symbol_ != 0xffffffff ||
                 (local_1c0[lVar26]->trivial_symbol_ != 0xffffffff)))) &&
               (bin_info[uVar3].num_combine_failures < 0x20)) {
              bin_info[uVar3].num_combine_failures = bin_info[uVar3].num_combine_failures + 1;
            }
            else {
              pVVar5 = local_1c0[lVar26];
              local_1c0[lVar26] = local_170;
              HistogramSetRemoveHistogram(image_histo,(int)lVar31,&num_used);
              puVar16[(long)dVar28 + (ulong)histogram_symbols[lVar31]] = histogram_symbols[lVar26];
              local_170 = pVVar5;
            }
          }
          uVar36 = local_1a8._0_4_;
          uVar39 = local_1a8._4_4_;
          __s = local_180;
          ppVVar25 = local_1c0;
        }
        else {
          HistogramAdd(pVVar5,ppVVar25[lVar26],ppVVar25[lVar26]);
          HistogramSetRemoveHistogram(image_histo,(int)lVar31,&num_used);
          uVar36 = local_1a8._0_4_;
          uVar39 = local_1a8._4_4_;
          puVar16[(long)dVar28 + (ulong)histogram_symbols[lVar31]] = histogram_symbols[lVar26];
          __s = local_180;
          ppVVar25 = local_1c0;
        }
      }
      lVar31 = lVar31 + 1;
      uVar22 = image_histo->size;
    }
    if ((int)local_1b0 != 0) {
      for (lVar31 = 0; lVar31 < (int)uVar22; lVar31 = lVar31 + 1) {
        if (ppVVar25[lVar31] != (VP8LHistogram *)0x0) {
          UpdateHistogramCost(ppVVar25[lVar31]);
          uVar22 = image_histo->size;
          __s = local_180;
          ppVVar25 = local_1c0;
        }
      }
    }
    bVar10 = true;
    while (bVar10) {
      bVar10 = false;
      for (uVar18 = 0; uVar18 != uVar35; uVar18 = uVar18 + 1) {
        uVar3 = puVar16[(long)dVar28 + uVar18];
        while( true ) {
          if (uVar3 == puVar16[(long)dVar28 + (ulong)uVar3]) break;
          uVar4 = puVar16[(long)dVar28 + (ulong)puVar16[(long)dVar28 + (ulong)uVar3]];
          puVar16[(long)dVar28 + (ulong)uVar3] = uVar4;
          uVar3 = uVar4;
        }
        if (uVar3 != puVar16[(long)dVar28 + uVar18]) {
          puVar16[(long)dVar28 + uVar18] = uVar3;
          bVar10 = true;
        }
      }
    }
    ppVVar25 = (VP8LHistogram **)0x0;
    memset(__s,0,(long)image_histo->max_size * 2);
    ppVVar34 = (VP8LHistogram **)(ulong)(uint)image_histo->max_size;
    if (image_histo->max_size < 1) {
      ppVVar34 = ppVVar25;
    }
    uVar27 = 0;
    for (; ppVVar34 != ppVVar25; ppVVar25 = (VP8LHistogram **)((long)ppVVar25 + 1)) {
      if ((ulong)histogram_symbols[(long)ppVVar25] != 0xffff) {
        uVar35 = (ulong)puVar16[(long)dVar28 + (ulong)histogram_symbols[(long)ppVVar25]];
        if (uVar35 == 0) {
          uVar20 = *local_180;
        }
        else {
          uVar20 = local_180[uVar35];
          if (uVar20 == 0) {
            uVar20 = uVar27 + 1;
            local_180[uVar35] = uVar20;
            uVar27 = uVar20;
          }
        }
        histogram_symbols[(long)ppVVar25] = uVar20;
      }
    }
    set = local_178;
    if ((int)local_1b0 == 0) {
      uVar35 = (ulong)(uint)num_used;
      goto LAB_0013507e;
    }
LAB_001356ba:
    RemoveEmptyHistograms(image_histo);
    ppVVar25 = set->histograms;
    ppVVar34 = image_histo->histograms;
    iVar21 = image_histo->size;
    uVar35 = 0;
    if (0 < image_histo->max_size) {
      uVar35 = (ulong)(uint)image_histo->max_size;
    }
    local_1a8._0_8_ = uVar35;
    if ((long)iVar21 < 2) {
      for (uVar18 = 0; uVar35 != uVar18; uVar18 = uVar18 + 1) {
        histogram_symbols[uVar18] = 0;
      }
    }
    else {
      for (lVar31 = 0; lVar31 != local_1a8._0_8_; lVar31 = lVar31 + 1) {
        if (ppVVar25[lVar31] == (VP8LHistogram *)0x0) {
          histogram_symbols[lVar31] = histogram_symbols[lVar31 + -1];
        }
        else {
          aVar38.first = -0x5e4f;
          aVar38.num_combine_failures = 0x2a16;
          aVar40.first = -0x312d;
          aVar40.num_combine_failures = 0x47d2;
          uVar36 = 0;
          for (lVar26 = 0; iVar21 != lVar26; lVar26 = lVar26 + 1) {
            pVVar5 = ppVVar34[lVar26];
            bin_info._0_8_ = -pVVar5->bit_cost_;
            local_1c0 = (VP8LHistogram **)CONCAT44(aVar40,aVar38);
            GetCombinedHistogramEntropy
                      (pVVar5,ppVVar25[lVar31],(double)CONCAT44(aVar40,aVar38),(double *)bin_info);
            aVar38 = SUB84(bin_info._0_8_,0);
            aVar40 = SUB84(bin_info._0_8_,4);
            if ((double)local_1c0 <= (double)bin_info._0_8_ && lVar26 != 0) {
              aVar38 = SUB84(local_1c0,0);
              aVar40 = SUB84((ulong)local_1c0 >> 0x20,0);
            }
            uVar39 = (int)lVar26;
            if ((double)local_1c0 <= (double)bin_info._0_8_ && lVar26 != 0) {
              uVar39 = uVar36;
            }
            uVar36 = uVar39;
          }
          histogram_symbols[lVar31] = (uint16_t)uVar36;
        }
      }
    }
    VP8LHistogramSetClear(image_histo);
    image_histo->size = iVar21;
    iVar21 = 1;
    for (lVar31 = 0; set = local_178, local_1a8._0_8_ != lVar31; lVar31 = lVar31 + 1) {
      if (ppVVar25[lVar31] != (VP8LHistogram *)0x0) {
        pVVar5 = ppVVar34[histogram_symbols[lVar31]];
        HistogramAdd(ppVVar25[lVar31],pVVar5,pVVar5);
      }
    }
  }
  else {
LAB_0013507e:
    set = local_178;
    fVar37 = (float)local_1b8 / 100.0;
    iVar21 = (int)(fVar37 * fVar37 * fVar37 * 99.0 + 1.0);
    iVar32 = (int)uVar35;
    local_1b8 = iVar32 / 2;
    local_168 = (double)CONCAT44(local_168._4_4_,iVar21);
    if (iVar32 < iVar21) {
LAB_001350cb:
      RemoveEmptyHistograms(image_histo);
      uVar33 = image_histo->size;
      ppVVar25 = image_histo->histograms;
      iVar21 = HistoQueueInit(&local_190,uVar33 * uVar33);
      if (iVar21 != 0) {
        ppVVar34 = (VP8LHistogram **)0x0;
        local_1c0 = (VP8LHistogram **)0x0;
        if (0 < (int)uVar33) {
          local_1c0 = (VP8LHistogram **)(ulong)uVar33;
        }
        lVar31 = 1;
        for (; ppVVar34 != local_1c0; ppVVar34 = (VP8LHistogram **)((long)ppVVar34 + 1)) {
          lVar26 = lVar31;
          if (image_histo->histograms[(long)ppVVar34] != (VP8LHistogram *)0x0) {
            for (; (int)lVar26 < (int)uVar33; lVar26 = lVar26 + 1) {
              if (image_histo->histograms[lVar26] != (VP8LHistogram *)0x0) {
                HistoQueuePush(&local_190,ppVVar25,(int)ppVVar34,(int)lVar26,0.0);
              }
            }
          }
          lVar31 = lVar31 + 1;
        }
        while (iVar21 = local_190.size, pHVar11 = local_190.queue, 0 < local_190.size) {
          uVar33 = (local_190.queue)->idx1;
          uVar22 = (local_190.queue)->idx2;
          HistogramAdd(ppVVar25[(int)uVar22],ppVVar25[(int)uVar33],ppVVar25[(int)uVar33]);
          ppVVar25[(int)uVar33]->bit_cost_ = pHVar11->cost_combo;
          HistogramSetRemoveHistogram(image_histo,uVar22,&num_used);
          iVar32 = 0;
LAB_00135246:
          pHVar24 = pHVar11 + iVar32;
          for (; iVar32 < iVar21; iVar32 = iVar32 + 1) {
            if ((((pHVar24->idx1 == uVar33) || (pHVar24->idx2 == uVar22)) ||
                (pHVar24->idx1 == uVar22)) || (pHVar24->idx2 == uVar33)) goto LAB_001352c6;
            if (pHVar24->cost_diff <= pHVar11->cost_diff && pHVar11->cost_diff != pHVar24->cost_diff
               ) {
              bin_info._16_8_ = pHVar11->cost_combo;
              bin_info[0] = (anon_struct_4_2_be341b0f)pHVar11->idx1;
              bin_info[1] = (anon_struct_4_2_be341b0f)pHVar11->idx2;
              dVar28 = pHVar11->cost_diff;
              pHVar11->cost_combo = pHVar24->cost_combo;
              iVar13 = pHVar24->idx2;
              dVar48 = pHVar24->cost_diff;
              pHVar11->idx1 = pHVar24->idx1;
              pHVar11->idx2 = iVar13;
              pHVar11->cost_diff = dVar48;
              pHVar24->cost_combo = (double)bin_info._16_8_;
              bin_info[2] = SUB84(dVar28,0);
              bin_info[3] = SUB84((ulong)dVar28 >> 0x20,0);
              pHVar24->idx1 = (int)bin_info[0];
              pHVar24->idx2 = (int)bin_info[1];
              *(anon_struct_4_2_be341b0f *)&pHVar24->cost_diff = bin_info[2];
              *(anon_struct_4_2_be341b0f *)((long)&pHVar24->cost_diff + 4) = bin_info[3];
              bin_info._8_8_ = dVar28;
            }
            pHVar24 = pHVar24 + 1;
          }
          local_190.size = iVar21;
          for (uVar35 = 0; (long)uVar35 < (long)image_histo->size; uVar35 = uVar35 + 1) {
            if ((uVar33 != uVar35) && (image_histo->histograms[uVar35] != (VP8LHistogram *)0x0)) {
              HistoQueuePush(&local_190,image_histo->histograms,uVar33,(int)uVar35,0.0);
            }
          }
        }
        WebPSafeFree(local_190.queue);
        set = local_178;
        goto LAB_001356ba;
      }
      WebPSafeFree(local_190.queue);
    }
    else {
      local_198 = (VP8LHistogram *)image_histo->histograms;
      local_1b0 = WebPSafeMalloc((long)iVar32,4);
      if (local_1b0 != (void *)0x0) {
        local_150 = HistoQueueInit(&local_190,9);
        if (local_150 != 0) {
          iVar21 = 0;
          for (lVar31 = 0; lVar31 < image_histo->size; lVar31 = lVar31 + 1) {
            if (*(long *)(local_198->red_ + lVar31 * 2 + -2) != 0) {
              lVar26 = (long)iVar21;
              iVar21 = iVar21 + 1;
              *(int *)((long)local_1b0 + lVar26 * 4) = (int)lVar31;
            }
          }
          uVar19 = 0;
          local_14c = 0;
          if (0 < iVar32) {
            local_14c = iVar32;
          }
          local_1c0 = (VP8LHistogram **)0x1;
          iVar21 = 0;
          while( true ) {
            auVar53 = local_148;
            iVar32 = (int)uVar35;
            if (((iVar21 == local_14c) || (iVar32 < local_168._0_4_)) ||
               (local_148._0_4_ = (int)uVar19 + 1, local_148._4_4_ = 0,
               local_1b8 <= (int)local_148._0_4_)) break;
            local_170 = (VP8LHistogram *)CONCAT44(local_170._4_4_,iVar21);
            local_148._8_8_ = auVar53._8_8_;
            if (local_190.size == 0) {
              dVar28 = 0.0;
            }
            else {
              dVar28 = (local_190.queue)->cost_diff;
            }
            auVar46._8_8_ = 0;
            auVar46._0_8_ = dVar28;
            local_1b4.first = 1;
            local_1b4.num_combine_failures = 0;
            uVar33 = iVar32 - 1;
            for (iVar21 = 0; (1 < iVar32 && (iVar21 < iVar32 / 2)); iVar21 = iVar21 + 1) {
              local_1c0 = (VP8LHistogram **)
                          ((((ulong)local_1c0 & 0xffffffff) * 0xbc8f) % 0x7fffffff);
              uVar23 = (ulong)local_1c0 % (ulong)(uVar33 * iVar32);
              uVar18 = uVar23 / uVar33;
              uVar22 = (uint)(uVar23 % (ulong)uVar33);
              local_1a8 = auVar46;
              dVar28 = HistoQueuePush(&local_190,(VP8LHistogram **)local_198,
                                      *(int *)((long)local_1b0 + uVar18 * 4),
                                      *(int *)((long)local_1b0 +
                                              (ulong)((uVar22 + 1) - (uint)(uVar22 < (uint)uVar18))
                                              * 4),auVar46._0_8_);
              if ((dVar28 < 0.0) && (local_190.size == local_190.max_size)) break;
              auVar45._0_8_ = local_1a8._0_8_ & -(ulong)(0.0 <= dVar28);
              auVar45._8_8_ = local_1a8._8_8_ & CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
              uVar18 = ~CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc) &
                       CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
              auVar9._8_4_ = (int)uVar18;
              auVar9._0_8_ = ~-(ulong)(0.0 <= dVar28) & (ulong)dVar28;
              auVar9._12_4_ = (int)(uVar18 >> 0x20);
              auVar46 = auVar45 | auVar9;
            }
            iVar21 = local_190.size;
            pHVar11 = local_190.queue;
            pvVar7 = local_1b0;
            uVar19 = local_148._0_8_;
            if (local_190.size != 0) {
              aVar38 = (anon_struct_4_2_be341b0f)(local_190.queue)->idx1;
              local_1b4 = (anon_struct_4_2_be341b0f)(local_190.queue)->idx2;
              __dest = bsearch(&local_1b4,local_1b0,(long)iVar32,4,PairComparison);
              memmove(__dest,(void *)((long)__dest + 4),
                      (((ulong)~((long)__dest - (long)pvVar7) >> 2) + (long)iVar32) * 4);
              pVVar5 = local_198;
              HistogramAdd(*(VP8LHistogram **)(local_198->red_ + (long)(int)local_1b4 * 2 + -2),
                           *(VP8LHistogram **)(local_198->red_ + (long)(int)aVar38 * 2 + -2),
                           *(VP8LHistogram **)(local_198->red_ + (long)(int)aVar38 * 2 + -2));
              *(double *)(*(long *)(pVVar5->red_ + (long)(int)aVar38 * 2 + -2) + 0xcb0) =
                   pHVar11->cost_combo;
              HistogramSetRemoveHistogram(image_histo,(int)local_1b4,&num_used);
              local_1a8._0_8_ = pHVar11 + -1;
              iVar32 = 0;
              do {
                pHVar24 = pHVar11 + iVar32;
                while( true ) {
                  if (iVar21 <= iVar32) {
                    uVar19 = 0;
                    uVar35 = (ulong)(uint)num_used;
                    local_190.size = iVar21;
                    goto LAB_00135670;
                  }
                  aVar40 = (anon_struct_4_2_be341b0f)pHVar24->idx1;
                  aVar14 = (anon_struct_4_2_be341b0f)pHVar24->idx2;
                  if ((aVar40 == local_1b4 || aVar40 == aVar38) &&
                     (aVar14 == local_1b4 || aVar14 == aVar38)) break;
                  if (aVar40 != local_1b4 && aVar40 != aVar38) {
                    bVar10 = true;
                    if (aVar14 == local_1b4 || aVar14 == aVar38) {
                      pHVar24->idx2 = (int)aVar38;
                      bVar10 = false;
                      aVar14 = aVar38;
                    }
                  }
                  else {
                    pHVar24->idx1 = (int)aVar38;
                    bVar10 = false;
                    aVar40 = aVar38;
                  }
                  aVar15 = aVar40;
                  if ((int)aVar14 < (int)aVar40) {
                    pHVar24->idx2 = (int)aVar40;
                    pHVar24->idx1 = (int)aVar14;
                    aVar15 = aVar14;
                    aVar14 = aVar40;
                  }
                  if (bVar10) {
                    uVar36 = SUB84(pHVar24->cost_diff,0);
                    uVar39 = (undefined4)((ulong)pHVar24->cost_diff >> 0x20);
                  }
                  else {
                    HistoQueueUpdatePair
                              (*(VP8LHistogram **)(local_198->red_ + (long)(int)aVar15 * 2 + -2),
                               *(VP8LHistogram **)(local_198->red_ + (long)(int)aVar14 * 2 + -2),0.0
                               ,pHVar24);
                    dVar28 = pHVar24->cost_diff;
                    uVar36 = SUB84(dVar28,0);
                    uVar39 = (undefined4)((ulong)dVar28 >> 0x20);
                    if (0.0 <= dVar28) break;
                  }
                  if ((double)CONCAT44(uVar39,uVar36) <= pHVar11->cost_diff &&
                      pHVar11->cost_diff != (double)CONCAT44(uVar39,uVar36)) {
                    bin_info._16_8_ = pHVar11->cost_combo;
                    bin_info[0] = (anon_struct_4_2_be341b0f)pHVar11->idx1;
                    bin_info[1] = (anon_struct_4_2_be341b0f)pHVar11->idx2;
                    bin_info._8_8_ = pHVar11->cost_diff;
                    pHVar11->cost_combo = pHVar24->cost_combo;
                    iVar13 = pHVar24->idx2;
                    dVar28 = pHVar24->cost_diff;
                    pHVar11->idx1 = pHVar24->idx1;
                    pHVar11->idx2 = iVar13;
                    pHVar11->cost_diff = dVar28;
                    pHVar24->cost_combo = (double)bin_info._16_8_;
                    pHVar24->idx1 = (int)bin_info[0];
                    pHVar24->idx2 = (int)bin_info[1];
                    pHVar24->cost_diff = (double)bin_info._8_8_;
                  }
                  iVar32 = iVar32 + 1;
                  pHVar24 = pHVar24 + 1;
                }
                pHVar24->cost_combo = *(double *)(local_1a8._0_8_ + 0x10 + (long)iVar21 * 0x18);
                puVar6 = (undefined8 *)(local_1a8._0_8_ + (long)iVar21 * 0x18);
                uVar19 = *puVar6;
                dVar28 = (double)puVar6[1];
                pHVar24->idx1 = (int)uVar19;
                pHVar24->idx2 = (int)((ulong)uVar19 >> 0x20);
                pHVar24->cost_diff = dVar28;
                iVar21 = iVar21 + -1;
              } while( true );
            }
LAB_00135670:
            iVar21 = (int)local_170 + 1;
            set = local_178;
          }
          ppVVar25 = (VP8LHistogram **)(ulong)(local_168._0_4_ < iVar32);
          local_148 = auVar53;
        }
        WebPSafeFree(local_190.queue);
        WebPSafeFree(local_1b0);
        if (local_150 != 0) {
          if (((ulong)ppVVar25 & 1) != 0) goto LAB_001356ba;
          goto LAB_001350cb;
        }
      }
    }
LAB_0013494d:
    iVar21 = 0;
  }
  WebPSafeFree(set);
  WebPSafeFree(local_180);
  return iVar21;
LAB_001352c6:
  pHVar24->cost_combo = pHVar11[(long)iVar21 + -1].cost_combo;
  pHVar1 = pHVar11 + (long)iVar21 + -1;
  iVar13 = pHVar1->idx2;
  uVar36 = *(undefined4 *)&pHVar1->cost_diff;
  uVar39 = *(undefined4 *)((long)&pHVar1->cost_diff + 4);
  pHVar24->idx1 = pHVar1->idx1;
  pHVar24->idx2 = iVar13;
  *(undefined4 *)&pHVar24->cost_diff = uVar36;
  *(undefined4 *)((long)&pHVar24->cost_diff + 4) = uVar39;
  iVar21 = iVar21 + -1;
  goto LAB_00135246;
}

Assistant:

int VP8LGetHistoImageSymbols(int xsize, int ysize,
                             const VP8LBackwardRefs* const refs,
                             int quality, int low_effort,
                             int histogram_bits, int cache_bits,
                             VP8LHistogramSet* const image_histo,
                             VP8LHistogram* const tmp_histo,
                             uint16_t* const histogram_symbols) {
  int ok = 0;
  const int histo_xsize =
      histogram_bits ? VP8LSubSampleSize(xsize, histogram_bits) : 1;
  const int histo_ysize =
      histogram_bits ? VP8LSubSampleSize(ysize, histogram_bits) : 1;
  const int image_histo_raw_size = histo_xsize * histo_ysize;
  VP8LHistogramSet* const orig_histo =
      VP8LAllocateHistogramSet(image_histo_raw_size, cache_bits);
  // Don't attempt linear bin-partition heuristic for
  // histograms of small sizes (as bin_map will be very sparse) and
  // maximum quality q==100 (to preserve the compression gains at that level).
  const int entropy_combine_num_bins = low_effort ? NUM_PARTITIONS : BIN_SIZE;
  int entropy_combine;
  uint16_t* const map_tmp =
      WebPSafeMalloc(2 * image_histo_raw_size, sizeof(map_tmp));
  uint16_t* const cluster_mappings = map_tmp + image_histo_raw_size;
  int num_used = image_histo_raw_size;
  if (orig_histo == NULL || map_tmp == NULL) goto Error;

  // Construct the histograms from backward references.
  HistogramBuild(xsize, histogram_bits, refs, orig_histo);
  // Copies the histograms and computes its bit_cost.
  // histogram_symbols is optimized
  HistogramCopyAndAnalyze(orig_histo, image_histo, &num_used,
                          histogram_symbols);

  entropy_combine =
      (num_used > entropy_combine_num_bins * 2) && (quality < 100);

  if (entropy_combine) {
    uint16_t* const bin_map = map_tmp;
    const double combine_cost_factor =
        GetCombineCostFactor(image_histo_raw_size, quality);
    const uint32_t num_clusters = num_used;

    HistogramAnalyzeEntropyBin(image_histo, bin_map, low_effort);
    // Collapse histograms with similar entropy.
    HistogramCombineEntropyBin(image_histo, &num_used, histogram_symbols,
                               cluster_mappings, tmp_histo, bin_map,
                               entropy_combine_num_bins, combine_cost_factor,
                               low_effort);
    OptimizeHistogramSymbols(image_histo, cluster_mappings, num_clusters,
                             map_tmp, histogram_symbols);
  }

  // Don't combine the histograms using stochastic and greedy heuristics for
  // low-effort compression mode.
  if (!low_effort || !entropy_combine) {
    const float x = quality / 100.f;
    // cubic ramp between 1 and MAX_HISTO_GREEDY:
    const int threshold_size = (int)(1 + (x * x * x) * (MAX_HISTO_GREEDY - 1));
    int do_greedy;
    if (!HistogramCombineStochastic(image_histo, &num_used, threshold_size,
                                    &do_greedy)) {
      goto Error;
    }
    if (do_greedy) {
      RemoveEmptyHistograms(image_histo);
      if (!HistogramCombineGreedy(image_histo, &num_used)) {
        goto Error;
      }
    }
  }

  // Find the optimal map from original histograms to the final ones.
  RemoveEmptyHistograms(image_histo);
  HistogramRemap(orig_histo, image_histo, histogram_symbols);

  ok = 1;

 Error:
  VP8LFreeHistogramSet(orig_histo);
  WebPSafeFree(map_tmp);
  return ok;
}